

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceEffectsObserver.cpp
# Opt level: O0

void __thiscall DiceEffectsObserver::update(DiceEffectsObserver *this)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  Dice *pDVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  string *psVar7;
  reference ppPVar8;
  string *__rhs;
  Dice *local_e8;
  Dice *local_d8;
  key_type local_c0 [6];
  Player *local_a8;
  Player *tempPlayer_1;
  iterator __end4;
  iterator __begin4;
  vector<Player_*,_std::allocator<Player_*>_> *__range4;
  Player *local_80;
  Player *tempPlayer;
  iterator __end3;
  iterator __begin3;
  vector<Player_*,_std::allocator<Player_*>_> *__range3;
  key_type local_58 [4];
  undefined1 local_48 [8];
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  unresolvedHand;
  Player *currentPlayer;
  DiceEffectsObserver *this_local;
  
  if (this->concreteSubject == (Subject *)0x0) {
    local_d8 = (Dice *)0x0;
  }
  else {
    local_d8 = (Dice *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Dice::typeinfo,0);
  }
  Dice::diceHistoricalValues(local_d8);
  if (this->concreteSubject == (Subject *)0x0) {
    local_e8 = (Dice *)0x0;
  }
  else {
    local_e8 = (Dice *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Dice::typeinfo,0);
  }
  iVar3 = Dice::getPlayerNumber(local_e8);
  unresolvedHand._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)Game::getPlayerByID(iVar3);
  pDVar4 = Player::getDice((Player *)unresolvedHand._M_t._M_impl.super__Rb_tree_header._M_node_count
                          );
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::map((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
         *)local_48,&pDVar4->DiceValues);
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "\n****************************************************************************"
                          );
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "-------------------- DICE EFFECT OBSERVER ----------------------------------"
                          );
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "****************************************************************************"
                          );
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "*************  The potential effect of your roll is : **********************"
                          );
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_58[0] = Energy;
  pmVar6 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                         *)local_48,local_58);
  if (0 < *pmVar6) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Player: ");
    psVar7 = Player::getPlayerName_abi_cxx11_
                       ((Player *)unresolvedHand._M_t._M_impl.super__Rb_tree_header._M_node_count);
    poVar5 = std::operator<<(poVar5,(string *)psVar7);
    poVar5 = std::operator<<(poVar5," added ");
    __range3._4_4_ = 0;
    pmVar6 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                           *)local_48,(key_type *)((long)&__range3 + 4));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pmVar6);
    poVar5 = std::operator<<(poVar5," energy points");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  __range3._0_4_ = 1;
  pmVar6 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                         *)local_48,(key_type *)&__range3);
  if (0 < *pmVar6) {
    iVar3 = Player::getZone((Player *)
                            unresolvedHand._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if ((iVar3 < 1) ||
       (iVar3 = Player::getZone((Player *)
                                unresolvedHand._M_t._M_impl.super__Rb_tree_header._M_node_count),
       6 < iVar3)) {
      iVar3 = Player::getZone((Player *)
                              unresolvedHand._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (6 < iVar3) {
        __end4 = std::vector<Player_*,_std::allocator<Player_*>_>::begin(&Game::players);
        tempPlayer_1 = (Player *)
                       std::vector<Player_*,_std::allocator<Player_*>_>::end(&Game::players);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
                                           *)&tempPlayer_1), bVar1) {
          ppPVar8 = __gnu_cxx::
                    __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
                    ::operator*(&__end4);
          local_a8 = *ppPVar8;
          psVar7 = Player::getPlayerName_abi_cxx11_(local_a8);
          __rhs = Player::getPlayerName_abi_cxx11_
                            ((Player *)
                             unresolvedHand._M_t._M_impl.super__Rb_tree_header._M_node_count);
          _Var2 = std::operator==(psVar7,__rhs);
          if (((!_Var2) && (iVar3 = Player::getZone(local_a8), 0 < iVar3)) &&
             (iVar3 = Player::getZone(local_a8), iVar3 < 7)) {
            poVar5 = std::operator<<((ostream *)&std::cout,"Player: ");
            psVar7 = Player::getPlayerName_abi_cxx11_(local_a8);
            poVar5 = std::operator<<(poVar5,(string *)psVar7);
            poVar5 = std::operator<<(poVar5," removed ");
            local_c0[5] = 1;
            pmVar6 = std::
                     map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                     ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                                   *)local_48,local_c0 + 5);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pmVar6);
            poVar5 = std::operator<<(poVar5," life points since he is inside manhattan");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
          __gnu_cxx::__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
          ::operator++(&__end4);
        }
      }
    }
    else {
      __end3 = std::vector<Player_*,_std::allocator<Player_*>_>::begin(&Game::players);
      tempPlayer = (Player *)std::vector<Player_*,_std::allocator<Player_*>_>::end(&Game::players);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
                                         *)&tempPlayer), bVar1) {
        ppPVar8 = __gnu_cxx::
                  __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
                  operator*(&__end3);
        local_80 = *ppPVar8;
        iVar3 = Player::getZone(local_80);
        if (6 < iVar3) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Player: ");
          psVar7 = Player::getPlayerName_abi_cxx11_(local_80);
          poVar5 = std::operator<<(poVar5,(string *)psVar7);
          poVar5 = std::operator<<(poVar5," removed ");
          __range4._4_4_ = 1;
          pmVar6 = std::
                   map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                   ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                                 *)local_48,(key_type *)((long)&__range4 + 4));
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pmVar6);
          poVar5 = std::operator<<(poVar5," life points since he is outside manhattan");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        __gnu_cxx::__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
        operator++(&__end3);
      }
    }
  }
  local_c0[4] = 2;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                *)local_48,local_c0 + 4);
  local_c0[3] = 3;
  pmVar6 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                         *)local_48,local_c0 + 3);
  bVar1 = false;
  if (0 < *pmVar6) {
    iVar3 = Player::getZone((Player *)
                            unresolvedHand._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = 6 < iVar3;
  }
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Player: ");
    psVar7 = Player::getPlayerName_abi_cxx11_
                       ((Player *)unresolvedHand._M_t._M_impl.super__Rb_tree_header._M_node_count);
    poVar5 = std::operator<<(poVar5,(string *)psVar7);
    poVar5 = std::operator<<(poVar5," can add ");
    local_c0[2] = 3;
    pmVar6 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                           *)local_48,local_c0 + 2);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pmVar6);
    poVar5 = std::operator<<(poVar5," health points");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  local_c0[1] = 4;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                *)local_48,local_c0 + 1);
  local_c0[0] = Ouch;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                *)local_48,local_c0);
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "****************************************************************************"
                          );
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::~map((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
          *)local_48);
  return;
}

Assistant:

void DiceEffectsObserver::update() {

    dynamic_cast<Dice*>(concreteSubject)->diceHistoricalValues();

    auto currentPlayer = Game::getPlayerByID(dynamic_cast<Dice*>(concreteSubject)->getPlayerNumber());

    map<Dice::DiceOptions, int> unresolvedHand = currentPlayer->getDice()->DiceValues;

    cout << "\n****************************************************************************" << endl;

    cout << "-------------------- DICE EFFECT OBSERVER ----------------------------------" << endl;

    cout << "****************************************************************************" << endl;
    cout << "*************  The potential effect of your roll is : **********************" << endl;

    if(unresolvedHand[Dice::Energy] > 0){ // Energy option
        cout << "Player: "<< currentPlayer->getPlayerName() << " added " << unresolvedHand[Dice::Energy] << " energy points" << endl;
    }

    if(unresolvedHand[Dice::Attack] > 0){ // Attack option
        if(currentPlayer->getZone()>0 && currentPlayer->getZone() < 7) { // In Manhattan
            for(auto tempPlayer : Game::players){
                if(tempPlayer->getZone() > 6){ // All players outside manhattan get -1 health
                    cout << "Player: "<< tempPlayer->getPlayerName() << " removed " << unresolvedHand[Dice::Attack] << " life points since he is outside manhattan" << endl;
                }
            }
        }
        else if(currentPlayer->getZone() > 6){ // Outside manhattan
            for(auto tempPlayer : Game::players){
                if(tempPlayer->getPlayerName() == currentPlayer->getPlayerName()){
                    continue;
                }
                if(tempPlayer->getZone() > 0 && tempPlayer->getZone() < 7){ // All players inside manhattan get -1 health
                    cout << "Player: "<< tempPlayer->getPlayerName() << " removed " << unresolvedHand[Dice::Attack] << " life points since he is inside manhattan" << endl;
                }
            }
        }
    }

    if(unresolvedHand[Dice::Destruction] > 0) { // Destruction option

    }

    if(unresolvedHand[Dice::Heal] > 0 && currentPlayer->getZone() >6) { // Heal Option
        cout << "Player: "<< currentPlayer->getPlayerName() << " can add " << unresolvedHand[Dice::Heal] << " health points" << endl;

    }

    if(unresolvedHand[Dice::Celebrity] > 0) { // Celebrity Option

    }

    if(unresolvedHand[Dice::Ouch] > 0) { // Ouch Option

    }
    cout << "****************************************************************************" << endl;

}